

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int leaveIdx,bool polish)

{
  undefined1 *result_00;
  int32_t iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar3;
  int *piVar4;
  Breakpoint *pBVar5;
  pointer pBVar6;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  max;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  max_00;
  type_conflict5 tVar8;
  bool bVar9;
  int iVar10;
  DataKey DVar11;
  undefined8 uVar12;
  pointer pnVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  multiprecision *pmVar23;
  uint uVar24;
  undefined4 *puVar25;
  cpp_dec_float<200U,_int,_void> *pcVar26;
  type *ptVar27;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar29;
  uint *puVar30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar31;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar32;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar33;
  pointer pBVar34;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar35;
  pointer pnVar36;
  multiprecision *pmVar37;
  uint *puVar38;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  fpclass_type fVar42;
  byte bVar43;
  ulong uVar44;
  pointer upp;
  BreakpointSource BVar45;
  undefined1 auStack_1168 [12];
  int nBp;
  uint local_1158;
  fpclass_type local_1154;
  undefined8 local_1150;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1148;
  undefined4 uStack_1140;
  int local_113c;
  int local_1138;
  int minIdx;
  undefined1 local_1130;
  undefined7 uStack_112f;
  SPxId enterId;
  undefined4 uStack_1120;
  uint local_111c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1118;
  pointer local_1110;
  pointer local_1108;
  undefined1 local_1100;
  undefined7 uStack_10ff;
  pointer local_10f8;
  pointer local_10f0;
  pointer local_10e8;
  pointer local_10e0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  BreakpointCompare local_fc0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  cpp_dec_float<200U,_int,_void> local_f28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absupd;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  stab;
  cpp_dec_float<200U,_int,_void> local_d28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ca8;
  uint local_c28 [28];
  Breakpoint tmp;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  multiprecision local_930 [112];
  int local_8c0;
  undefined1 local_8bc;
  fpclass_type local_8b8;
  int32_t local_8b4;
  multiprecision local_8b0 [112];
  int local_840;
  undefined1 local_83c;
  fpclass_type local_838;
  int32_t local_834;
  uint local_830 [28];
  int local_7c0;
  undefined1 local_7bc;
  fpclass_type local_7b8;
  int32_t iStack_7b4;
  uint local_7b0 [28];
  int local_740;
  undefined1 local_73c;
  fpclass_type local_738;
  int32_t iStack_734;
  multiprecision local_730 [112];
  int local_6c0;
  undefined1 local_6bc;
  fpclass_type local_6b8;
  int32_t iStack_6b4;
  multiprecision local_6b0 [112];
  int local_640;
  undefined1 local_63c;
  fpclass_type local_638;
  int32_t iStack_634;
  multiprecision local_630 [112];
  int local_5c0;
  undefined1 local_5bc;
  undefined8 local_5b8;
  multiprecision local_5b0 [112];
  int local_540;
  undefined1 local_53c;
  undefined8 local_538;
  multiprecision local_530 [112];
  int local_4c0;
  undefined1 local_4bc;
  undefined8 local_4b8;
  uint local_4b0 [28];
  int local_440;
  undefined1 local_43c;
  fpclass_type local_438;
  int32_t iStack_434;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  uint local_330 [28];
  int local_2c0;
  undefined1 local_2bc;
  fpclass_type local_2b8;
  int32_t iStack_2b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  multiprecision local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  multiprecision local_b0 [112];
  undefined4 local_40;
  undefined1 local_3c;
  undefined8 local_38;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  
  bVar43 = 0;
  if (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->leaveCount % 100 == 0) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)
               &(this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).field_0x234,1);
  }
  if (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).field_0x231 == '\x01' && !polish) &&
     (((this->
       super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .thesolver)->theRep != ROW)) {
    result_00 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).field_0x234;
    tmp.val.m_backend.data._M_elems._0_8_ =
         tmp.val.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
    tVar8 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)result_00,(int *)&tmp);
    if (!tVar8) {
      pSVar2 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .thesolver;
      pUVar35 = pSVar2->theCoPvec;
      pUVar3 = pSVar2->thePvec;
      local_10e0 = (pUVar3->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_1110 = (pUVar3->thedelta).
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      piVar4 = (pUVar3->thedelta).super_IdxSet.idx;
      local_1130 = SUB81(piVar4,0);
      uStack_112f = (undefined7)((ulong)piVar4 >> 8);
      local_1154 = (pUVar3->thedelta).super_IdxSet.num;
      local_1118 = (pSVar2->theLbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      pnVar28 = (pSVar2->theUbound->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_10e8 = (pUVar35->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_1108 = (pUVar35->thedelta).
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_1148 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(pUVar35->thedelta).super_IdxSet.idx;
      local_1150._0_4_ = (pUVar35->thedelta).super_IdxSet.num;
      local_10f0 = (pSVar2->theCoLbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_10f8 = (pSVar2->theCoUbound->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      tmp.val.m_backend.fpclass = cpp_dec_float_finite;
      tmp.val.m_backend.prec_elem = 0x1c;
      tmp.val.m_backend.data._M_elems[0] = 0;
      tmp.val.m_backend.data._M_elems[1] = 0;
      tmp.val.m_backend.data._M_elems[2] = 0;
      tmp.val.m_backend.data._M_elems[3] = 0;
      tmp.val.m_backend.data._M_elems[4] = 0;
      tmp.val.m_backend.data._M_elems[5] = 0;
      tmp.val.m_backend.data._M_elems[6] = 0;
      tmp.val.m_backend.data._M_elems[7] = 0;
      tmp.val.m_backend.data._M_elems[8] = 0;
      tmp.val.m_backend.data._M_elems[9] = 0;
      tmp.val.m_backend.data._M_elems[10] = 0;
      tmp.val.m_backend.data._M_elems[0xb] = 0;
      tmp.val.m_backend.data._M_elems[0xc] = 0;
      tmp.val.m_backend.data._M_elems[0xd] = 0;
      tmp.val.m_backend.data._M_elems[0xe] = 0;
      tmp.val.m_backend.data._M_elems[0xf] = 0;
      tmp.val.m_backend.data._M_elems[0x10] = 0;
      tmp.val.m_backend.data._M_elems[0x11] = 0;
      tmp.val.m_backend.data._M_elems[0x12] = 0;
      tmp.val.m_backend.data._M_elems[0x13] = 0;
      tmp.val.m_backend.data._M_elems[0x18] = 0;
      tmp.val.m_backend.data._M_elems[0x19] = 0;
      tmp.val.m_backend.data._M_elems._104_5_ = 0;
      tmp.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      tmp.val.m_backend.exp = 0;
      tmp.val.m_backend.neg = false;
      tmp.val.m_backend.data._M_elems[0x14] = 0;
      tmp.val.m_backend.data._M_elems[0x15] = 0;
      tmp.val.m_backend.data._M_elems[0x16] = 0;
      tmp.val.m_backend.data._M_elems[0x17] = 0;
      local_f28.fpclass = cpp_dec_float_finite;
      local_f28.prec_elem = 0x1c;
      local_f28.data._M_elems[0] = 0;
      local_f28.data._M_elems[1] = 0;
      local_f28.data._M_elems[2] = 0;
      local_f28.data._M_elems[3] = 0;
      local_f28.data._M_elems[4] = 0;
      local_f28.data._M_elems[5] = 0;
      local_f28.data._M_elems[6] = 0;
      local_f28.data._M_elems[7] = 0;
      local_f28.data._M_elems[8] = 0;
      local_f28.data._M_elems[9] = 0;
      local_f28.data._M_elems[10] = 0;
      local_f28.data._M_elems[0xb] = 0;
      local_f28.data._M_elems[0xc] = 0;
      local_f28.data._M_elems[0xd] = 0;
      local_f28.data._M_elems[0xe] = 0;
      local_f28.data._M_elems[0xf] = 0;
      local_f28.data._M_elems[0x10] = 0;
      local_f28.data._M_elems[0x11] = 0;
      local_f28.data._M_elems[0x12] = 0;
      local_f28.data._M_elems[0x13] = 0;
      local_f28.data._M_elems[0x18] = 0;
      local_f28.data._M_elems[0x19] = 0;
      local_f28.data._M_elems._104_5_ = 0;
      local_f28.data._M_elems[0x1b]._1_3_ = 0;
      local_f28.exp = 0;
      local_f28.neg = false;
      local_f28.data._M_elems[0x14] = 0;
      local_f28.data._M_elems[0x15] = 0;
      local_f28.data._M_elems[0x16] = 0;
      local_f28.data._M_elems[0x17] = 0;
      enterId.super_DataKey.info = 0;
      enterId.super_DataKey.idx = -1;
      local_d28.fpclass = cpp_dec_float_finite;
      local_d28.prec_elem = 0x1c;
      local_d28.data._M_elems[0] = 0;
      local_d28.data._M_elems[1] = 0;
      local_d28.data._M_elems[2] = 0;
      local_d28.data._M_elems[3] = 0;
      local_d28.data._M_elems[4] = 0;
      local_d28.data._M_elems[5] = 0;
      local_d28.data._M_elems[6] = 0;
      local_d28.data._M_elems[7] = 0;
      local_d28.data._M_elems[8] = 0;
      local_d28.data._M_elems[9] = 0;
      local_d28.data._M_elems[10] = 0;
      local_d28.data._M_elems[0xb] = 0;
      local_d28.data._M_elems[0xc] = 0;
      local_d28.data._M_elems[0xd] = 0;
      local_d28.data._M_elems[0xe] = 0;
      local_d28.data._M_elems[0xf] = 0;
      local_d28.data._M_elems[0x18] = 0;
      local_d28.data._M_elems[0x19] = 0;
      local_d28.data._M_elems._104_5_ = 0;
      local_d28.data._M_elems[0x1b]._1_3_ = 0;
      local_d28.exp = 0;
      local_d28.neg = false;
      local_d28.data._M_elems[0x10] = 0;
      local_d28.data._M_elems[0x11] = 0;
      local_d28.data._M_elems[0x12] = 0;
      local_d28.data._M_elems[0x13] = 0;
      local_d28.data._M_elems[0x14] = 0;
      local_d28.data._M_elems[0x15] = 0;
      local_d28.data._M_elems[0x16] = 0;
      local_d28.data._M_elems[0x17] = 0;
      local_c28[0x18] = 0;
      local_c28[0x19] = 0;
      local_c28[0x1a] = 0;
      local_c28[0x1b] = 0;
      local_c28[0x14] = 0;
      local_c28[0x15] = 0;
      local_c28[0x16] = 0;
      local_c28[0x17] = 0;
      local_c28[0x10] = 0;
      local_c28[0x11] = 0;
      local_c28[0x12] = 0;
      local_c28[0x13] = 0;
      local_c28[0xc] = 0;
      local_c28[0xd] = 0;
      local_c28[0xe] = 0;
      local_c28[0xf] = 0;
      local_c28[8] = 0;
      local_c28[9] = 0;
      local_c28[10] = 0;
      local_c28[0xb] = 0;
      local_c28[4] = 0;
      local_c28[5] = 0;
      local_c28[6] = 0;
      local_c28[7] = 0;
      local_c28[0] = 0;
      local_c28[1] = 0;
      local_c28[2] = 0;
      local_c28[3] = 0;
      stab.m_backend.fpclass = cpp_dec_float_finite;
      stab.m_backend.prec_elem = 0x1c;
      stab.m_backend.data._M_elems[0] = 0;
      stab.m_backend.data._M_elems[1] = 0;
      stab.m_backend.data._M_elems[2] = 0;
      stab.m_backend.data._M_elems[3] = 0;
      stab.m_backend.data._M_elems[4] = 0;
      stab.m_backend.data._M_elems[5] = 0;
      stab.m_backend.data._M_elems[6] = 0;
      stab.m_backend.data._M_elems[7] = 0;
      stab.m_backend.data._M_elems[8] = 0;
      stab.m_backend.data._M_elems[9] = 0;
      stab.m_backend.data._M_elems[10] = 0;
      stab.m_backend.data._M_elems[0xb] = 0;
      stab.m_backend.data._M_elems[0xc] = 0;
      stab.m_backend.data._M_elems[0xd] = 0;
      stab.m_backend.data._M_elems[0xe] = 0;
      stab.m_backend.data._M_elems[0xf] = 0;
      stab.m_backend.data._M_elems[0x10] = 0;
      stab.m_backend.data._M_elems[0x11] = 0;
      stab.m_backend.data._M_elems[0x12] = 0;
      stab.m_backend.data._M_elems[0x13] = 0;
      stab.m_backend.data._M_elems[0x14] = 0;
      stab.m_backend.data._M_elems[0x15] = 0;
      stab.m_backend.data._M_elems[0x16] = 0;
      stab.m_backend.data._M_elems[0x17] = 0;
      stab.m_backend.data._M_elems[0x18] = 0;
      stab.m_backend.data._M_elems[0x19] = 0;
      stab.m_backend.data._M_elems._104_5_ = 0;
      stab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      stab.m_backend.exp = 0;
      stab.m_backend.neg = false;
      pnVar22 = val;
      pnVar29 = &local_ca8;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pnVar29->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
        pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
      }
      local_ca8.m_backend.exp = (val->m_backend).exp;
      local_ca8.m_backend.neg = (val->m_backend).neg;
      local_ca8.m_backend.fpclass = (val->m_backend).fpclass;
      local_ca8.m_backend.prec_elem = (val->m_backend).prec_elem;
      local_113c = leaveIdx;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)val,0.0);
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_f28,0.0);
      nBp = 0;
      minIdx = -1;
      absupd.m_backend.data._M_elems._0_8_ = (ulong)absupd.m_backend.data._M_elems[1] << 0x20;
      tVar8 = boost::multiprecision::operator>(&local_ca8,(int *)&absupd);
      if (tVar8) {
        collectBreakpointsMax
                  (this,&nBp,&minIdx,(int *)CONCAT71(uStack_112f,local_1130),local_1154,local_1110,
                   local_10e0,pnVar28,local_1118,PVEC);
        collectBreakpointsMax
                  (this,&nBp,&minIdx,(int *)local_1148,(int)local_1150,local_1108,local_10e8,
                   local_10f8,local_10f0,COPVEC);
      }
      else {
        collectBreakpointsMin
                  (this,&nBp,&minIdx,(int *)CONCAT71(uStack_112f,local_1130),local_1154,local_1110,
                   local_10e0,pnVar28,local_1118,PVEC);
        collectBreakpointsMin
                  (this,&nBp,&minIdx,(int *)local_1148,(int)local_1150,local_1108,local_10e8,
                   local_10f8,local_10f0,COPVEC);
      }
      if (nBp == 0) {
        pnVar28 = &local_ca8;
        pnVar22 = val;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
          pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar28 + ((ulong)bVar43 * -2 + 1) * 4);
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
        }
        (val->m_backend).exp = local_ca8.m_backend.exp;
        (val->m_backend).neg = local_ca8.m_backend.neg;
        (val->m_backend).fpclass = local_ca8.m_backend.fpclass;
        (val->m_backend).prec_elem = local_ca8.m_backend.prec_elem;
        uVar12._0_4_ = enterId.super_DataKey.info;
        uVar12._4_4_ = enterId.super_DataKey.idx;
        return (SPxId)uVar12;
      }
      local_1148 = val;
      Breakpoint::operator=
                (&tmp,(this->breakpoints).data.
                      super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                      ._M_impl.super__Vector_impl_data._M_start + minIdx);
      pBVar5 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Breakpoint::operator=(pBVar5 + minIdx,pBVar5);
      Breakpoint::operator=
                ((this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start,&tmp);
      pnVar17 = (((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver)->theCoTest).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)local_113c * 0x80);
      lVar18 = 0x1c;
      puVar25 = (undefined4 *)((long)(pnVar22->m_backend).data._M_elems + (long)pnVar17);
      pmVar23 = local_b0;
      for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(undefined4 *)pmVar23 = *puVar25;
        puVar25 = puVar25 + (ulong)bVar43 * -2 + 1;
        pmVar23 = pmVar23 + (ulong)bVar43 * -8 + 4;
      }
      local_40 = *(undefined4 *)((long)(&(pnVar22->m_backend).data + 1) + (long)pnVar17);
      local_3c = *(undefined1 *)
                  ((long)(&(pnVar22->m_backend).data + 1) +
                  (long)((long)&(pnVar17->m_backend).data + 4U));
      local_38 = *(undefined8 *)
                  ((long)(&(pnVar22->m_backend).data + 1) +
                  (long)((long)&(pnVar17->m_backend).data + 8U));
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&absupd,local_b0,pnVar22);
      ptVar27 = &absupd;
      pcVar26 = &local_d28;
      for (; lVar18 != 0; lVar18 = lVar18 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar26->data)->data)._M_elems[0] =
             (ptVar27->m_backend).data._M_elems[0];
        ptVar27 = (type *)((long)ptVar27 + ((ulong)bVar43 * -2 + 1) * 4);
        pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + ((ulong)bVar43 * -2 + 1) * 4);
      }
      local_d28.exp = absupd.m_backend.exp;
      local_d28.neg = absupd.m_backend.neg;
      local_d28.fpclass = absupd.m_backend.fpclass;
      local_d28.prec_elem = absupd.m_backend.prec_elem;
      absupd.m_backend.data._M_elems._0_8_ =
           absupd.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar8 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d28,(int *)&absupd);
      if (tVar8) {
        pSVar2 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        lVar18 = 0x1c;
        pnVar22 = &pSVar2->instableLeaveVal;
        pmVar23 = local_130;
        for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
          *(uint *)pmVar23 = (pnVar22->m_backend).data._M_elems[0];
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + (ulong)bVar43 * -8 + 4);
          pmVar23 = pmVar23 + (ulong)bVar43 * -8 + 4;
        }
        local_c0 = (pSVar2->instableLeaveVal).m_backend.exp;
        local_bc = (pSVar2->instableLeaveVal).m_backend.neg;
        local_b8._0_4_ = (pSVar2->instableLeaveVal).m_backend.fpclass;
        local_b8._4_4_ = (pSVar2->instableLeaveVal).m_backend.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&absupd,local_130,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)pSVar2);
        ptVar27 = &absupd;
        pcVar26 = &local_d28;
        for (; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pcVar26->data)._M_elems[0] = (ptVar27->m_backend).data._M_elems[0];
          ptVar27 = (type *)((long)ptVar27 + ((ulong)bVar43 * -2 + 1) * 4);
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + ((ulong)bVar43 * -2 + 1) * 4)
          ;
        }
        local_d28.exp = absupd.m_backend.exp;
        local_d28.neg = absupd.m_backend.neg;
        local_d28.fpclass = absupd.m_backend.fpclass;
        local_d28.prec_elem = absupd.m_backend.prec_elem;
      }
      local_fc0.entry =
           (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = 0;
      uVar41 = 0;
      iVar10 = 0;
      while( true ) {
        iVar39 = (int)uVar41;
        if (nBp <= iVar39) break;
        absupd.m_backend.data._M_elems._0_8_ =
             absupd.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar8 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_d28,(int *)&absupd);
        if (!tVar8) break;
        if (iVar10 < iVar39) {
          iVar10 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                             ((this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_start,&local_fc0,iVar10 + 1,nBp,4,
                              0,0,true);
        }
        pBVar6 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar21 = *(int *)((long)(&pBVar6->val + 1) + lVar18);
        pSVar2 = (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .thesolver;
        if (*(int *)((long)&pBVar6->src + lVar18) == 0) {
          if (0 < pSVar2->theRep *
                  ((pSVar2->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.stat)->data[iVar21]) {
            *(undefined4 *)((long)(&pBVar6->val + 1) + lVar18) = 0xffffffff;
            pUVar35 = pSVar2->thePvec;
            goto LAB_004570d4;
          }
          pnVar22 = local_1110 + iVar21;
          pmVar23 = local_5b0;
          for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
            *(uint *)pmVar23 = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
            pmVar23 = pmVar23 + (ulong)bVar43 * -8 + 4;
          }
          local_540 = local_1110[iVar21].m_backend.exp;
          local_53c = local_1110[iVar21].m_backend.neg;
          local_538._0_4_ = local_1110[iVar21].m_backend.fpclass;
          local_538._4_4_ = local_1110[iVar21].m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&absupd,local_5b0,local_1110);
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,
                     &(((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend,&absupd.m_backend)
          ;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,
                     &(((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend,&absupd.m_backend)
          ;
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x1c;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems[6] = 0;
          lowstab.m_backend.data._M_elems[7] = 0;
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.data._M_elems[0x10] = 0;
          lowstab.m_backend.data._M_elems[0x11] = 0;
          lowstab.m_backend.data._M_elems[0x12] = 0;
          lowstab.m_backend.data._M_elems[0x13] = 0;
          lowstab.m_backend.data._M_elems[0x14] = 0;
          lowstab.m_backend.data._M_elems[0x15] = 0;
          lowstab.m_backend.data._M_elems[0x16] = 0;
          lowstab.m_backend.data._M_elems[0x17] = 0;
          lowstab.m_backend.data._M_elems[0x18] = 0;
          lowstab.m_backend.data._M_elems[0x19] = 0;
          lowstab.m_backend.data._M_elems._104_5_ = 0;
          lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&lowstab.m_backend,&result.m_backend,&result_1.m_backend);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_d28,&lowstab.m_backend);
          tVar8 = boost::multiprecision::operator>
                            (&absupd,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_f28);
          if (tVar8) {
            pnVar22 = &absupd;
            pcVar26 = &local_f28;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pcVar26->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar26 + ((ulong)bVar43 * -2 + 1) * 4);
            }
            local_f28.exp = absupd.m_backend.exp;
            local_f28.neg = absupd.m_backend.neg;
            local_f28.fpclass = absupd.m_backend.fpclass;
            local_f28.prec_elem = absupd.m_backend.prec_elem;
          }
        }
        else if (pSVar2->theRep *
                 ((pSVar2->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.costat)->data[iVar21] < 1) {
          local_1150._4_4_ = (undefined4)(uVar41 >> 0x20);
          pnVar22 = local_1108 + iVar21;
          pmVar23 = local_630;
          for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
            *(uint *)pmVar23 = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
            pmVar23 = pmVar23 + (ulong)bVar43 * -8 + 4;
          }
          local_5c0 = local_1108[iVar21].m_backend.exp;
          local_5bc = local_1108[iVar21].m_backend.neg;
          local_5b8._0_4_ = local_1108[iVar21].m_backend.fpclass;
          local_5b8._4_4_ = local_1108[iVar21].m_backend.prec_elem;
          local_1150._0_4_ = iVar39;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((type *)&absupd.m_backend,local_630,local_1108);
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,
                     &(((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend,&absupd.m_backend)
          ;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,
                     &(((this->
                        super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .thesolver)->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar21].m_backend,&absupd.m_backend)
          ;
          lowstab.m_backend.fpclass = cpp_dec_float_finite;
          lowstab.m_backend.prec_elem = 0x1c;
          lowstab.m_backend.data._M_elems[0] = 0;
          lowstab.m_backend.data._M_elems[1] = 0;
          lowstab.m_backend.data._M_elems[2] = 0;
          lowstab.m_backend.data._M_elems[3] = 0;
          lowstab.m_backend.data._M_elems[4] = 0;
          lowstab.m_backend.data._M_elems[5] = 0;
          lowstab.m_backend.data._M_elems[6] = 0;
          lowstab.m_backend.data._M_elems[7] = 0;
          lowstab.m_backend.data._M_elems[8] = 0;
          lowstab.m_backend.data._M_elems[9] = 0;
          lowstab.m_backend.data._M_elems[10] = 0;
          lowstab.m_backend.data._M_elems[0xb] = 0;
          lowstab.m_backend.data._M_elems[0xc] = 0;
          lowstab.m_backend.data._M_elems[0xd] = 0;
          lowstab.m_backend.data._M_elems[0xe] = 0;
          lowstab.m_backend.data._M_elems[0xf] = 0;
          lowstab.m_backend.data._M_elems[0x10] = 0;
          lowstab.m_backend.data._M_elems[0x11] = 0;
          lowstab.m_backend.data._M_elems[0x12] = 0;
          lowstab.m_backend.data._M_elems[0x13] = 0;
          lowstab.m_backend.data._M_elems[0x14] = 0;
          lowstab.m_backend.data._M_elems[0x15] = 0;
          lowstab.m_backend.data._M_elems[0x16] = 0;
          lowstab.m_backend.data._M_elems[0x17] = 0;
          lowstab.m_backend.data._M_elems[0x18] = 0;
          lowstab.m_backend.data._M_elems[0x19] = 0;
          lowstab.m_backend.data._M_elems._104_5_ = 0;
          lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          lowstab.m_backend.exp = 0;
          lowstab.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&lowstab.m_backend,&result.m_backend,&result_1.m_backend);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&local_d28,&lowstab.m_backend);
          tVar8 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&absupd.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_f28);
          if (tVar8) {
            pnVar22 = &absupd;
            pcVar26 = &local_f28;
            for (lVar19 = 0x1c; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pcVar26->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar26 + ((ulong)bVar43 * -2 + 1) * 4);
            }
            local_f28.exp = absupd.m_backend.exp;
            local_f28.neg = absupd.m_backend.neg;
            local_f28.fpclass = absupd.m_backend.fpclass;
            local_f28.prec_elem = absupd.m_backend.prec_elem;
          }
          uVar41 = CONCAT44(local_1150._4_4_,(int)local_1150);
        }
        else {
          *(undefined4 *)((long)(&pBVar6->val + 1) + lVar18) = 0xffffffff;
          pUVar35 = pSVar2->theCoPvec;
LAB_004570d4:
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::clearIdx(&pUVar35->thedelta,iVar21);
        }
        uVar41 = uVar41 + 1;
        lVar18 = lVar18 + 0x88;
      }
      lVar19 = uVar41 - 1;
      local_111c = (uint)lVar19;
      local_1150 = &(this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .delta.m_backend;
      tVar8 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d28,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_1150);
      if ((!tVar8) || (iVar39 < nBp)) {
        pBVar6 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar30 = (uint *)((long)&pBVar6[-1].val.m_backend + lVar18);
        pnVar22 = &absupd;
        for (lVar20 = 0x1c; lVar20 != 0; lVar20 = lVar20 + -1) {
          (pnVar22->m_backend).data._M_elems[0] = *puVar30;
          puVar30 = puVar30 + (ulong)bVar43 * -2 + 1;
          pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
        }
        absupd.m_backend.exp = *(int *)((long)&(pBVar6->val).m_backend + lVar18 + -0x18);
        absupd.m_backend.neg = *(bool *)((long)&(pBVar6->val).m_backend + lVar18 + -0x14);
        absupd.m_backend._120_8_ = *(undefined8 *)((long)&(pBVar6->val).m_backend + lVar18 + -0x10);
        local_1158 = 0xffffffff;
        local_1100 = (undefined1)lVar19;
        uStack_10ff = (undefined7)((ulong)lVar19 >> 8);
        do {
          lVar20 = lVar19 * 0x88 + 0x108;
          lVar18 = lVar19;
          while( true ) {
            lVar19 = lVar18 + 1;
            if (nBp <= lVar19) goto LAB_00457df2;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&lowstab.m_backend,0,(type *)0x0);
            if (iVar10 <= lVar18) {
              iVar10 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Breakpoint,soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::BreakpointCompare>
                                 ((this->breakpoints).data.
                                  super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                                  ._M_impl.super__Vector_impl_data._M_start,&local_fc0,iVar10 + 1,
                                  nBp,4,0,0,true);
            }
            pBVar6 = (this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar39 = *(int *)((long)&(pBVar6->val).m_backend + lVar20);
            pSVar2 = (this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .thesolver;
            if (*(int *)((long)&(pBVar6->val).m_backend + lVar20 + 4) == 0) {
              iVar21 = pSVar2->theRep *
                       ((pSVar2->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thedesc.stat)->data[iVar39];
              if (0 < iVar21) {
                *(undefined4 *)((long)&(pBVar6->val).m_backend + lVar20) = 0xffffffff;
                pUVar35 = pSVar2->thePvec;
                goto LAB_00457733;
              }
              lVar18 = 0x1c;
              pnVar22 = local_1110 + iVar39;
              pnVar29 = &result;
              for (lVar20 = lVar18; lVar20 != 0; lVar20 = lVar20 + -1) {
                (pnVar29->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
                pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
              }
              result.m_backend.exp = local_1110[iVar39].m_backend.exp;
              result.m_backend.neg = local_1110[iVar39].m_backend.neg;
              result.m_backend.fpclass = local_1110[iVar39].m_backend.fpclass;
              result.m_backend.prec_elem = local_1110[iVar39].m_backend.prec_elem;
              pnVar22 = &result;
              pmVar23 = local_8b0;
              for (; lVar18 != 0; lVar18 = lVar18 + -1) {
                *(uint *)pmVar23 = (pnVar22->m_backend).data._M_elems[0];
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
                pmVar23 = pmVar23 + (ulong)bVar43 * -8 + 4;
              }
              local_840 = result.m_backend.exp;
              local_83c = result.m_backend.neg;
              local_838 = result.m_backend.fpclass;
              local_834 = result.m_backend.prec_elem;
              boost::multiprecision::
              abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_1,local_8b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)(ulong)CONCAT31((int3)((uint)iVar21 >> 8),result.m_backend.neg));
              tVar8 = boost::multiprecision::operator>
                                (&result_1,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_f28);
              if (tVar8) {
                pSVar2 = (this->
                         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .thesolver;
                pSVar7 = pSVar2->thevectors;
                SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator*(&result_1,
                            (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)((pSVar7->set).theitem + (pSVar7->set).thekey[iVar39].idx),
                            &pSVar2->theCoPvec->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           );
                pnVar17 = (((this->
                            super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .thesolver)->thePvec->
                          super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pnVar22 = &result_1;
                pnVar36 = pnVar17 + iVar39;
                for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                  *(uint *)&pnVar36->m_backend = (pnVar22->m_backend).data._M_elems[0];
                  pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
                  pnVar36 = (pointer)((long)pnVar36 + ((ulong)bVar43 * -2 + 1) * 4);
                }
                *(int *)((long)(pnVar17 + iVar39) + 0x70) = result_1.m_backend.exp;
                *(bool *)((long)(pnVar17 + iVar39) + 0x74) = result_1.m_backend.neg;
                *(undefined8 *)((long)(pnVar17 + iVar39) + 0x78) = result_1.m_backend._120_8_;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                tVar8 = boost::multiprecision::operator>(&result,(double *)&result_1);
                pnVar22 = local_1118;
                if (tVar8) {
                  pnVar22 = pnVar28;
                }
                pnVar29 = pnVar22 + iVar39;
                pcVar26 = &lowstab.m_backend;
                for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                  (pcVar26->data)._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
                  pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar43 * -8 + 4);
                }
                lowstab.m_backend.exp = pnVar22[iVar39].m_backend.exp;
                lowstab.m_backend.neg = pnVar22[iVar39].m_backend.neg;
                lowstab.m_backend.fpclass = pnVar22[iVar39].m_backend.fpclass;
                lowstab.m_backend.prec_elem = pnVar22[iVar39].m_backend.prec_elem;
                result_4.m_backend.fpclass = cpp_dec_float_finite;
                result_4.m_backend.prec_elem = 0x1c;
                result_4.m_backend.data._M_elems[0] = 0;
                result_4.m_backend.data._M_elems[1] = 0;
                result_4.m_backend.data._M_elems[2] = 0;
                result_4.m_backend.data._M_elems[3] = 0;
                result_4.m_backend.data._M_elems[4] = 0;
                result_4.m_backend.data._M_elems[5] = 0;
                result_4.m_backend.data._M_elems[6] = 0;
                result_4.m_backend.data._M_elems[7] = 0;
                result_4.m_backend.data._M_elems[8] = 0;
                result_4.m_backend.data._M_elems[9] = 0;
                result_4.m_backend.data._M_elems[10] = 0;
                result_4.m_backend.data._M_elems[0xb] = 0;
                result_4.m_backend.data._M_elems[0xc] = 0;
                result_4.m_backend.data._M_elems[0xd] = 0;
                result_4.m_backend.data._M_elems[0xe] = 0;
                result_4.m_backend.data._M_elems[0xf] = 0;
                result_4.m_backend.data._M_elems[0x10] = 0;
                result_4.m_backend.data._M_elems[0x11] = 0;
                result_4.m_backend.data._M_elems[0x12] = 0;
                result_4.m_backend.data._M_elems[0x13] = 0;
                result_4.m_backend.data._M_elems[0x14] = 0;
                result_4.m_backend.data._M_elems[0x15] = 0;
                result_4.m_backend.data._M_elems[0x16] = 0;
                result_4.m_backend.data._M_elems[0x17] = 0;
                result_4.m_backend.data._M_elems[0x18] = 0;
                result_4.m_backend.data._M_elems[0x19] = 0;
                result_4.m_backend.data._M_elems._104_5_ = 0;
                result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_4.m_backend.exp = 0;
                result_4.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_4.m_backend,&lowstab.m_backend,&local_10e0[iVar39].m_backend);
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_1.m_backend,&result_4.m_backend,&result.m_backend);
                lVar18 = 0x1c;
                pcVar26 = &result_1.m_backend;
                pnVar22 = &lowstab;
                for (lVar20 = lVar18; lVar20 != 0; lVar20 = lVar20 + -1) {
                  (pnVar22->m_backend).data._M_elems[0] = (pcVar26->data)._M_elems[0];
                  pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar26 + (ulong)bVar43 * -8 + 4);
                  pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
                }
                lowstab.m_backend.exp = result_1.m_backend.exp;
                lowstab.m_backend.neg = result_1.m_backend.neg;
                lowstab.m_backend.fpclass = result_1.m_backend.fpclass;
                lowstab.m_backend.prec_elem = result_1.m_backend.prec_elem;
                tVar8 = boost::multiprecision::operator<=(&lowstab,&absupd);
                if (!tVar8) goto LAB_00457d67;
                pmVar23 = local_6b0;
                pnVar22 = &result;
                pmVar37 = pmVar23;
                for (; lVar18 != 0; lVar18 = lVar18 + -1) {
                  *(uint *)pmVar37 = (pnVar22->m_backend).data._M_elems[0];
                  pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
                  pmVar37 = pmVar37 + (ulong)bVar43 * -8 + 4;
                }
                local_640 = result.m_backend.exp;
                local_63c = result.m_backend.neg;
                local_638 = result.m_backend.fpclass;
                iStack_634 = result.m_backend.prec_elem;
                goto LAB_00457d09;
              }
              goto LAB_00457d67;
            }
            iVar21 = pSVar2->theRep *
                     ((pSVar2->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thedesc.costat)->data[iVar39];
            if (iVar21 < 1) break;
            *(undefined4 *)((long)&(pBVar6->val).m_backend + lVar20) = 0xffffffff;
            pUVar35 = pSVar2->theCoPvec;
LAB_00457733:
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::clearIdx(&pUVar35->thedelta,iVar39);
            lVar20 = lVar20 + 0x88;
            lVar18 = lVar19;
          }
          lVar18 = 0x1c;
          pnVar22 = local_1108 + iVar39;
          pnVar29 = &result;
          for (lVar20 = lVar18; lVar20 != 0; lVar20 = lVar20 + -1) {
            (pnVar29->m_backend).data._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
            pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
          }
          result.m_backend.exp = local_1108[iVar39].m_backend.exp;
          result.m_backend.neg = local_1108[iVar39].m_backend.neg;
          result.m_backend.fpclass = local_1108[iVar39].m_backend.fpclass;
          result.m_backend.prec_elem = local_1108[iVar39].m_backend.prec_elem;
          pnVar22 = &result;
          pmVar23 = local_930;
          for (; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(uint *)pmVar23 = (pnVar22->m_backend).data._M_elems[0];
            pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
            pmVar23 = pmVar23 + (ulong)bVar43 * -8 + 4;
          }
          local_8c0 = result.m_backend.exp;
          local_8bc = result.m_backend.neg;
          local_8b8 = result.m_backend.fpclass;
          local_8b4 = result.m_backend.prec_elem;
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    ((type *)&result_1.m_backend,local_930,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)CONCAT31((int3)((uint)iVar21 >> 8),result.m_backend.neg));
          tVar8 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_1.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_f28);
          if (tVar8) {
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            tVar8 = boost::multiprecision::operator>(&result,(double *)&result_1.m_backend);
            pnVar17 = local_10f0;
            if (tVar8) {
              pnVar17 = local_10f8;
            }
            pnVar22 = pnVar17 + iVar39;
            pcVar26 = &lowstab.m_backend;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pcVar26->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar43 * -8 + 4);
            }
            lowstab.m_backend.exp = pnVar17[iVar39].m_backend.exp;
            lowstab.m_backend.neg = pnVar17[iVar39].m_backend.neg;
            lowstab.m_backend.fpclass = pnVar17[iVar39].m_backend.fpclass;
            lowstab.m_backend.prec_elem = pnVar17[iVar39].m_backend.prec_elem;
            result_4.m_backend.fpclass = cpp_dec_float_finite;
            result_4.m_backend.prec_elem = 0x1c;
            result_4.m_backend.data._M_elems[0] = 0;
            result_4.m_backend.data._M_elems[1] = 0;
            result_4.m_backend.data._M_elems[2] = 0;
            result_4.m_backend.data._M_elems[3] = 0;
            result_4.m_backend.data._M_elems[4] = 0;
            result_4.m_backend.data._M_elems[5] = 0;
            result_4.m_backend.data._M_elems[6] = 0;
            result_4.m_backend.data._M_elems[7] = 0;
            result_4.m_backend.data._M_elems[8] = 0;
            result_4.m_backend.data._M_elems[9] = 0;
            result_4.m_backend.data._M_elems[10] = 0;
            result_4.m_backend.data._M_elems[0xb] = 0;
            result_4.m_backend.data._M_elems[0xc] = 0;
            result_4.m_backend.data._M_elems[0xd] = 0;
            result_4.m_backend.data._M_elems[0xe] = 0;
            result_4.m_backend.data._M_elems[0xf] = 0;
            result_4.m_backend.data._M_elems[0x10] = 0;
            result_4.m_backend.data._M_elems[0x11] = 0;
            result_4.m_backend.data._M_elems[0x12] = 0;
            result_4.m_backend.data._M_elems[0x13] = 0;
            result_4.m_backend.data._M_elems[0x14] = 0;
            result_4.m_backend.data._M_elems[0x15] = 0;
            result_4.m_backend.data._M_elems[0x16] = 0;
            result_4.m_backend.data._M_elems[0x17] = 0;
            result_4.m_backend.data._M_elems[0x18] = 0;
            result_4.m_backend.data._M_elems[0x19] = 0;
            result_4.m_backend.data._M_elems._104_5_ = 0;
            result_4.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_4.m_backend.exp = 0;
            result_4.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_4.m_backend,&lowstab.m_backend,&local_10e8[iVar39].m_backend);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,&result_4.m_backend,&result.m_backend);
            pcVar26 = &result_1.m_backend;
            pnVar22 = &lowstab;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pnVar22->m_backend).data._M_elems[0] = (pcVar26->data)._M_elems[0];
              pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar43 * -8 + 4);
              pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
            }
            lowstab.m_backend.exp = result_1.m_backend.exp;
            lowstab.m_backend.neg = result_1.m_backend.neg;
            lowstab.m_backend.fpclass = result_1.m_backend.fpclass;
            lowstab.m_backend.prec_elem = result_1.m_backend.prec_elem;
            tVar8 = boost::multiprecision::operator<=(&lowstab,&absupd);
            if (tVar8) {
              pmVar23 = local_730;
              pnVar22 = &result;
              pmVar37 = pmVar23;
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                *(uint *)pmVar37 = (pnVar22->m_backend).data._M_elems[0];
                pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
                pmVar37 = pmVar37 + (ulong)bVar43 * -8 + 4;
              }
              local_6c0 = result.m_backend.exp;
              local_6bc = result.m_backend.neg;
              local_6b8 = result.m_backend.fpclass;
              iStack_6b4 = result.m_backend.prec_elem;
LAB_00457d09:
              boost::multiprecision::
              abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result_1,pmVar23,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)pmVar23);
              ptVar27 = &result_1;
              pcVar26 = &local_f28;
              for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
                (pcVar26->data)._M_elems[0] = (ptVar27->m_backend).data._M_elems[0];
                ptVar27 = (type *)((long)ptVar27 + ((ulong)bVar43 * -2 + 1) * 4);
                pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar26 + ((ulong)bVar43 * -2 + 1) * 4);
              }
              local_f28.exp = result_1.m_backend.exp;
              local_f28.neg = result_1.m_backend.neg;
              local_f28.fpclass = result_1.m_backend.fpclass;
              local_f28.prec_elem = result_1.m_backend.prec_elem;
              local_1158 = (uint)lVar19;
            }
          }
LAB_00457d67:
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x1c;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems[0xe] = 0;
          result.m_backend.data._M_elems[0xf] = 0;
          result.m_backend.data._M_elems[0x10] = 0;
          result.m_backend.data._M_elems[0x11] = 0;
          result.m_backend.data._M_elems[0x12] = 0;
          result.m_backend.data._M_elems[0x13] = 0;
          result.m_backend.data._M_elems[0x14] = 0;
          result.m_backend.data._M_elems[0x15] = 0;
          result.m_backend.data._M_elems[0x16] = 0;
          result.m_backend.data._M_elems[0x17] = 0;
          result.m_backend.data._M_elems[0x18] = 0;
          result.m_backend.data._M_elems[0x19] = 0;
          result.m_backend.data._M_elems._104_5_ = 0;
          result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result.m_backend,local_1150,&absupd.m_backend);
          tVar8 = boost::multiprecision::operator>
                            (&lowstab,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&result.m_backend);
        } while (!tVar8);
LAB_00457df2:
        pnVar22 = &(this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta;
        lowstab.m_backend.fpclass = cpp_dec_float_finite;
        lowstab.m_backend.prec_elem = 0x1c;
        lowstab.m_backend.data._M_elems[0] = 0;
        lowstab.m_backend.data._M_elems[1] = 0;
        lowstab.m_backend.data._M_elems[2] = 0;
        lowstab.m_backend.data._M_elems[3] = 0;
        lowstab.m_backend.data._M_elems[4] = 0;
        lowstab.m_backend.data._M_elems[5] = 0;
        lowstab.m_backend.data._M_elems[6] = 0;
        lowstab.m_backend.data._M_elems[7] = 0;
        lowstab.m_backend.data._M_elems[8] = 0;
        lowstab.m_backend.data._M_elems[9] = 0;
        lowstab.m_backend.data._M_elems[10] = 0;
        lowstab.m_backend.data._M_elems[0xb] = 0;
        lowstab.m_backend.data._M_elems[0xc] = 0;
        lowstab.m_backend.data._M_elems[0xd] = 0;
        lowstab.m_backend.data._M_elems[0xe] = 0;
        lowstab.m_backend.data._M_elems[0xf] = 0;
        lowstab.m_backend.data._M_elems[0x10] = 0;
        lowstab.m_backend.data._M_elems[0x11] = 0;
        lowstab.m_backend.data._M_elems[0x12] = 0;
        lowstab.m_backend.data._M_elems[0x13] = 0;
        lowstab.m_backend.data._M_elems[0x14] = 0;
        lowstab.m_backend.data._M_elems[0x15] = 0;
        lowstab.m_backend.data._M_elems[0x16] = 0;
        lowstab.m_backend.data._M_elems[0x17] = 0;
        lowstab.m_backend.data._M_elems[0x18] = 0;
        lowstab.m_backend.data._M_elems[0x19] = 0;
        lowstab.m_backend.data._M_elems._104_5_ = 0;
        lowstab.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        lowstab.m_backend.exp = 0;
        lowstab.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&lowstab.m_backend,&pnVar22->m_backend,&local_f28);
        pcVar26 = &lowstab.m_backend;
        puVar30 = local_c28;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          *puVar30 = (pcVar26->data)._M_elems[0];
          pcVar26 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar26 + (ulong)bVar43 * -8 + 4);
          puVar30 = puVar30 + (ulong)bVar43 * -2 + 1;
        }
        local_1138 = lowstab.m_backend.exp;
        local_1130 = lowstab.m_backend.neg;
        local_1154 = lowstab.m_backend.fpclass;
        local_1150._0_4_ = lowstab.m_backend.prec_elem;
        bVar9 = ((this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .thesolver)->instableLeave;
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result,
                   &(this->
                    super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)
        ;
        uVar44 = -(ulong)(*(double *)(result.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&lowstab.m_backend,
                   (double)(~uVar44 & (ulong)(*(double *)
                                               (result.m_backend.data._M_elems._0_8_ + 0x40) * 1e-10
                                             ) | uVar44 & 0x3ddb7cdfd9d7bdbb),(type *)0x0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result.m_backend.data._M_elems + 2));
        lVar18 = 0x1c;
        if (bVar9 == false) {
          pcVar26 = &local_f28;
          pnVar29 = &local_1b0;
          for (; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pnVar29->m_backend).data._M_elems[0] = (pcVar26->data)._M_elems[0];
            pcVar26 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar26 + ((ulong)bVar43 * -2 + 1) * 4);
            pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
          }
          local_1b0.m_backend.exp = local_f28.exp;
          local_1b0.m_backend.neg = local_f28.neg;
          local_1b0.m_backend.fpclass = local_f28.fpclass;
          local_1b0.m_backend.prec_elem = local_f28.prec_elem;
          SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::minStability(&result,&this->
                                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ,&local_1b0);
          pnVar29 = &result;
          fVar42 = result.m_backend.fpclass;
        }
        else {
          pnVar29 = &lowstab;
          pnVar32 = &result;
          for (; lVar18 != 0; lVar18 = lVar18 + -1) {
            (pnVar32->m_backend).data._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
            pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
            pnVar32 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar32 + ((ulong)bVar43 * -2 + 1) * 4);
          }
          result.m_backend.exp = lowstab.m_backend.exp;
          result.m_backend.neg = lowstab.m_backend.neg;
          result.m_backend.fpclass = lowstab.m_backend.fpclass;
          pnVar29 = &lowstab;
          fVar42 = lowstab.m_backend.fpclass;
        }
        iVar1 = (pnVar29->m_backend).prec_elem;
        pnVar29 = &result;
        pnVar32 = &stab;
        for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
          (pnVar32->m_backend).data._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
          pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
          pnVar32 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar32 + ((ulong)bVar43 * -2 + 1) * 4);
        }
        stab.m_backend.exp = result.m_backend.exp;
        stab.m_backend.neg = result.m_backend.neg;
        stab.m_backend.prec_elem = iVar1;
        stab.m_backend.fpclass = fVar42;
        if ((int)local_1158 < 0) {
          bVar9 = false;
          lVar18 = 0x1c;
          pnVar29 = local_1118;
          local_1158 = result.m_backend.exp;
          local_1100 = result.m_backend.neg;
          while ((uVar40 = (uint)uVar41, bVar9 == false && (uVar24 = uVar40 - 1, -1 < (int)uVar24)))
          {
            pBVar6 = (this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar10 = pBVar6[uVar24].idx;
            if (iVar10 < 0) {
              bVar9 = false;
            }
            else {
              if (pBVar6[uVar24].src == PVEC) {
                pnVar32 = &local_9b0;
                pnVar33 = &stab;
                pnVar31 = pnVar32;
                for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
                  (pnVar31->m_backend).data._M_elems[0] = (pnVar33->m_backend).data._M_elems[0];
                  pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
                  pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar31 + ((ulong)bVar43 * -2 + 1) * 4);
                }
                local_9b0.m_backend.exp = local_1158;
                local_9b0.m_backend.neg = (bool)local_1100;
                local_9b0.m_backend.fpclass = fVar42;
                local_9b0.m_backend.prec_elem = iVar1;
                pnVar33 = &local_a30;
                puVar30 = local_c28;
                pnVar31 = pnVar33;
                for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
                  (pnVar31->m_backend).data._M_elems[0] = *puVar30;
                  puVar30 = puVar30 + (ulong)bVar43 * -2 + 1;
                  pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar31 + ((ulong)bVar43 * -2 + 1) * 4);
                }
                local_a30.m_backend.exp = local_1138;
                local_a30.m_backend.neg = (bool)local_1130;
                local_a30.m_backend.fpclass = local_1154;
                local_a30.m_backend.prec_elem = (int)local_1150;
                puVar30 = local_7b0;
                pnVar31 = &local_ca8;
                puVar38 = puVar30;
                for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
                  *puVar38 = (pnVar31->m_backend).data._M_elems[0];
                  pnVar31 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar31 + ((ulong)bVar43 * -2 + 1) * 4);
                  puVar38 = puVar38 + (ulong)bVar43 * -2 + 1;
                }
                local_740 = local_ca8.m_backend.exp;
                local_73c = local_ca8.m_backend.neg;
                local_738 = local_ca8.m_backend.fpclass;
                iStack_734 = local_ca8.m_backend.prec_elem;
                BVar45 = PVEC;
                pnVar17 = local_1110;
                pnVar36 = local_10e0;
                upp = pnVar28;
              }
              else {
                pnVar32 = &local_ab0;
                pnVar29 = &stab;
                pnVar33 = pnVar32;
                for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
                  (pnVar33->m_backend).data._M_elems[0] = (pnVar29->m_backend).data._M_elems[0];
                  pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
                  pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
                }
                local_ab0.m_backend.exp = local_1158;
                local_ab0.m_backend.neg = (bool)local_1100;
                local_ab0.m_backend.fpclass = fVar42;
                local_ab0.m_backend.prec_elem = iVar1;
                pnVar33 = &local_b30;
                puVar30 = local_c28;
                pnVar29 = pnVar33;
                for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
                  (pnVar29->m_backend).data._M_elems[0] = *puVar30;
                  puVar30 = puVar30 + (ulong)bVar43 * -2 + 1;
                  pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
                }
                local_b30.m_backend.exp = local_1138;
                local_b30.m_backend.neg = (bool)local_1130;
                local_b30.m_backend.fpclass = local_1154;
                local_b30.m_backend.prec_elem = (int)local_1150;
                puVar30 = local_830;
                pnVar29 = &local_ca8;
                puVar38 = puVar30;
                for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
                  *puVar38 = (pnVar29->m_backend).data._M_elems[0];
                  pnVar29 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar29 + ((ulong)bVar43 * -2 + 1) * 4);
                  puVar38 = puVar38 + (ulong)bVar43 * -2 + 1;
                }
                local_7c0 = local_ca8.m_backend.exp;
                local_7bc = local_ca8.m_backend.neg;
                local_7b8 = local_ca8.m_backend.fpclass;
                iStack_7b4 = local_ca8.m_backend.prec_elem;
                BVar45 = COPVEC;
                pnVar17 = local_1108;
                pnVar36 = local_10e8;
                pnVar29 = local_10f0;
                upp = local_10f8;
              }
              max.m_backend.data._M_elems._8_12_ = auStack_1168;
              max.m_backend.data._M_elems._0_8_ = puVar30;
              max.m_backend.data._M_elems[5] = nBp;
              max.m_backend.data._M_elems[6] = local_1158;
              max.m_backend.data._M_elems[7] = local_1154;
              max.m_backend.data._M_elems[8] = (int)local_1150;
              max.m_backend.data._M_elems[9] = local_1150._4_4_;
              max.m_backend.data._M_elems._40_8_ = local_1148;
              max.m_backend.data._M_elems[0xc] = uStack_1140;
              max.m_backend.data._M_elems[0xd] = local_113c;
              max.m_backend.data._M_elems[0xe] = local_1138;
              max.m_backend.data._M_elems[0xf] = minIdx;
              max.m_backend.data._M_elems[0x10]._0_1_ = local_1130;
              max.m_backend.data._M_elems._65_7_ = uStack_112f;
              max.m_backend.data._M_elems[0x12] = enterId.super_DataKey.info;
              max.m_backend.data._M_elems[0x13] = enterId.super_DataKey.idx;
              max.m_backend.data._M_elems[0x14] = uStack_1120;
              max.m_backend.data._M_elems[0x15] = local_111c;
              max.m_backend.data._M_elems._88_8_ = local_1118;
              max.m_backend.data._M_elems._96_8_ = local_1110;
              max.m_backend.data._M_elems._104_8_ = local_1108;
              max.m_backend.exp._0_1_ = local_1100;
              max.m_backend._113_7_ = uStack_10ff;
              max.m_backend._120_8_ = local_10f8;
              bVar9 = getData(this,local_1148,&enterId,iVar10,pnVar32,pnVar33,pnVar17,pnVar36,
                              pnVar29,upp,BVar45,max);
              pnVar29 = local_1118;
            }
            local_111c = uVar40 - 2;
            uVar41 = (ulong)uVar24;
          }
          iVar10 = local_113c;
          local_111c = uVar40;
          if (bVar9 == false) goto LAB_0045851d;
        }
        else {
          tVar8 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_f28,&stab);
          iVar10 = local_113c;
          if (!tVar8) {
LAB_0045851d:
            if (1 < this->relax_count) {
              uVar13._0_4_ = enterId.super_DataKey.info;
              uVar13._4_4_ = enterId.super_DataKey.idx;
              return (SPxId)uVar13;
            }
            SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::relax(&this->
                     super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
            this->relax_count = this->relax_count + 1;
            pnVar28 = &local_ca8;
            pnVar22 = local_1148;
            for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
              (pnVar22->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
              pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar28 + ((ulong)bVar43 * -2 + 1) * 4);
              pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
            }
            (local_1148->m_backend).exp = local_ca8.m_backend.exp;
            (local_1148->m_backend).neg = local_ca8.m_backend.neg;
            (local_1148->m_backend).fpclass = local_ca8.m_backend.fpclass;
            (local_1148->m_backend).prec_elem = local_ca8.m_backend.prec_elem;
            DVar11 = (DataKey)selectEnter(this,local_1148,iVar10,false);
            uVar16._0_4_ = DVar11.info;
            uVar16._4_4_ = DVar11.idx;
            return (SPxId)uVar16;
          }
          pBVar6 = (this->breakpoints).data.
                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar39 = pBVar6[local_1158].idx;
          if (pBVar6[local_1158].src == PVEC) {
            pnVar29 = &local_230;
            lVar18 = 0x1c;
            pnVar32 = &stab;
            pnVar33 = pnVar29;
            for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar33->m_backend).data._M_elems[0] = (pnVar32->m_backend).data._M_elems[0];
              pnVar32 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar32 + ((ulong)bVar43 * -2 + 1) * 4);
              pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
            }
            local_230.m_backend.exp = stab.m_backend.exp;
            local_230.m_backend.neg = stab.m_backend.neg;
            local_230.m_backend.fpclass = stab.m_backend.fpclass;
            local_230.m_backend.prec_elem = stab.m_backend.prec_elem;
            pnVar32 = &local_2b0;
            puVar30 = local_c28;
            pnVar33 = pnVar32;
            for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar33->m_backend).data._M_elems[0] = *puVar30;
              puVar30 = puVar30 + (ulong)bVar43 * -2 + 1;
              pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
            }
            local_2b0.m_backend.exp = local_1138;
            local_2b0.m_backend.neg = (bool)local_1130;
            local_2b0.m_backend.fpclass = local_1154;
            local_2b0.m_backend.prec_elem = (int)local_1150;
            puVar30 = local_330;
            pnVar33 = &local_ca8;
            puVar38 = puVar30;
            for (; lVar18 != 0; lVar18 = lVar18 + -1) {
              *puVar38 = (pnVar33->m_backend).data._M_elems[0];
              pnVar33 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar33 + ((ulong)bVar43 * -2 + 1) * 4);
              puVar38 = puVar38 + (ulong)bVar43 * -2 + 1;
            }
            local_2c0 = local_ca8.m_backend.exp;
            local_2bc = local_ca8.m_backend.neg;
            local_2b8 = local_ca8.m_backend.fpclass;
            iStack_2b4 = local_ca8.m_backend.prec_elem;
            BVar45 = PVEC;
            pnVar17 = local_1110;
            pnVar36 = local_10e0;
            pnVar33 = local_1118;
          }
          else {
            pnVar29 = &local_3b0;
            lVar18 = 0x1c;
            pnVar28 = &stab;
            pnVar32 = pnVar29;
            for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar32->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
              pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar28 + ((ulong)bVar43 * -2 + 1) * 4);
              pnVar32 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar32 + ((ulong)bVar43 * -2 + 1) * 4);
            }
            local_3b0.m_backend.exp = stab.m_backend.exp;
            local_3b0.m_backend.neg = stab.m_backend.neg;
            local_3b0.m_backend.fpclass = stab.m_backend.fpclass;
            local_3b0.m_backend.prec_elem = stab.m_backend.prec_elem;
            pnVar32 = &local_430;
            puVar30 = local_c28;
            pnVar28 = pnVar32;
            for (lVar19 = lVar18; lVar19 != 0; lVar19 = lVar19 + -1) {
              (pnVar28->m_backend).data._M_elems[0] = *puVar30;
              puVar30 = puVar30 + (ulong)bVar43 * -2 + 1;
              pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar28 + ((ulong)bVar43 * -2 + 1) * 4);
            }
            local_430.m_backend.exp = local_1138;
            local_430.m_backend.neg = (bool)local_1130;
            local_430.m_backend.fpclass = local_1154;
            local_430.m_backend.prec_elem = (int)local_1150;
            puVar30 = local_4b0;
            pnVar28 = &local_ca8;
            puVar38 = puVar30;
            for (; lVar18 != 0; lVar18 = lVar18 + -1) {
              *puVar38 = (pnVar28->m_backend).data._M_elems[0];
              pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar28 + ((ulong)bVar43 * -2 + 1) * 4);
              puVar38 = puVar38 + (ulong)bVar43 * -2 + 1;
            }
            local_440 = local_ca8.m_backend.exp;
            local_43c = local_ca8.m_backend.neg;
            local_438 = local_ca8.m_backend.fpclass;
            iStack_434 = local_ca8.m_backend.prec_elem;
            BVar45 = COPVEC;
            pnVar17 = local_1108;
            pnVar36 = local_10e8;
            pnVar33 = local_10f0;
            pnVar28 = local_10f8;
          }
          max_00.m_backend.data._M_elems._8_12_ = auStack_1168;
          max_00.m_backend.data._M_elems._0_8_ = puVar30;
          max_00.m_backend.data._M_elems[5] = nBp;
          max_00.m_backend.data._M_elems[6] = local_1158;
          max_00.m_backend.data._M_elems[7] = local_1154;
          max_00.m_backend.data._M_elems[8] = (int)local_1150;
          max_00.m_backend.data._M_elems[9] = local_1150._4_4_;
          max_00.m_backend.data._M_elems._40_8_ = local_1148;
          max_00.m_backend.data._M_elems[0xc] = uStack_1140;
          max_00.m_backend.data._M_elems[0xd] = local_113c;
          max_00.m_backend.data._M_elems[0xe] = local_1138;
          max_00.m_backend.data._M_elems[0xf] = minIdx;
          max_00.m_backend.data._M_elems[0x10]._0_1_ = local_1130;
          max_00.m_backend.data._M_elems._65_7_ = uStack_112f;
          max_00.m_backend.data._M_elems[0x12] = enterId.super_DataKey.info;
          max_00.m_backend.data._M_elems[0x13] = enterId.super_DataKey.idx;
          max_00.m_backend.data._M_elems[0x14] = uStack_1120;
          max_00.m_backend.data._M_elems[0x15] = local_111c;
          max_00.m_backend.data._M_elems._88_8_ = local_1118;
          max_00.m_backend.data._M_elems._96_8_ = local_1110;
          max_00.m_backend.data._M_elems._104_8_ = local_1108;
          max_00.m_backend.exp._0_1_ = local_1100;
          max_00.m_backend._113_7_ = uStack_10ff;
          max_00.m_backend._120_8_ = local_10f8;
          bVar9 = getData(this,local_1148,&enterId,iVar39,pnVar29,pnVar32,pnVar17,pnVar36,pnVar33,
                          pnVar28,BVar45,max_00);
          if (!bVar9) goto LAB_0045851d;
          uVar40 = (uint)CONCAT71(uStack_10ff,local_1100);
        }
        this->relax_count = 0;
        SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tighten(&this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 );
        if (0 < (int)uVar40) {
          pBVar6 = (this->breakpoints).data.
                   super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pBVar34 = pBVar6 + uVar40;
          pmVar23 = local_530;
          for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
            *(undefined4 *)pmVar23 = *(undefined4 *)&(pBVar34->val).m_backend;
            pBVar34 = (pointer)((long)pBVar34 + ((ulong)bVar43 * -2 + 1) * 4);
            pmVar23 = pmVar23 + (ulong)bVar43 * -8 + 4;
          }
          local_4c0 = *(int *)((long)&pBVar6[uVar40].val.m_backend + 0x70);
          local_4bc = *(bool *)((long)&pBVar6[uVar40].val.m_backend + 0x74);
          local_4b8 = *(undefined8 *)((long)&pBVar6[uVar40].val.m_backend + 0x78);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result,local_530,&pBVar6->val);
          tVar8 = boost::multiprecision::operator>(&result,pnVar22);
          if (tVar8) {
            flipAndUpdate(this,(int *)&local_111c);
            ((this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .thesolver)->boundflips = local_111c;
            if (9 < (int)local_111c) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                        ((cpp_dec_float<200U,_int,_void> *)result_00,1);
              uVar15._0_4_ = enterId.super_DataKey.info;
              uVar15._4_4_ = enterId.super_DataKey.idx;
              return (SPxId)uVar15;
            }
            result.m_backend.data._M_elems[0] = 0x9999999a;
            result.m_backend.data._M_elems[1] = 0x3fa99999;
            goto LAB_00458589;
          }
        }
        ((this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).
         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .thesolver)->boundflips = 0;
        result.m_backend.data._M_elems[0] = 0x9999999a;
        result.m_backend.data._M_elems[1] = 0x3fb99999;
LAB_00458589:
        boost::multiprecision::default_ops::
        eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  ((cpp_dec_float<200U,_int,_void> *)result_00,(double *)&result);
        uVar14._0_4_ = enterId.super_DataKey.info;
        uVar14._4_4_ = enterId.super_DataKey.idx;
        return (SPxId)uVar14;
      }
      absupd.m_backend.data._M_elems[0] = 0;
      absupd.m_backend.data._M_elems[1] = 0x3fe00000;
      boost::multiprecision::default_ops::
      eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                ((cpp_dec_float<200U,_int,_void> *)result_00,(double *)&absupd);
      pnVar28 = &local_ca8;
      pnVar22 = local_1148;
      for (lVar18 = 0x1c; lVar18 != 0; lVar18 = lVar18 + -1) {
        (pnVar22->m_backend).data._M_elems[0] = (pnVar28->m_backend).data._M_elems[0];
        pnVar28 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar28 + ((ulong)bVar43 * -2 + 1) * 4);
        pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar22 + ((ulong)bVar43 * -2 + 1) * 4);
      }
      (local_1148->m_backend).exp = local_ca8.m_backend.exp;
      (local_1148->m_backend).neg = local_ca8.m_backend.neg;
      (local_1148->m_backend).fpclass = local_ca8.m_backend.fpclass;
      (local_1148->m_backend).prec_elem = local_ca8.m_backend.prec_elem;
      polish = false;
      val = local_1148;
      leaveIdx = local_113c;
      goto LAB_00456ac8;
    }
  }
LAB_00456ac8:
  DVar11 = (DataKey)SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::selectEnter(&this->
                                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ,val,leaveIdx,polish);
  return (SPxId)DVar11;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}